

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2gal.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  double dVar3;
  CESkyCoord gal_coord;
  CESkyCoord cirs_coord;
  CEDate date;
  CEExecOptions opts;
  CEAngle local_3e0 [16];
  CEAngle local_3d0 [20];
  CESkyCoordType local_3bc;
  string local_3b8;
  double local_388;
  double local_380;
  CESkyCoord local_378 [48];
  string local_348 [5];
  CEDate local_298 [64];
  CEExecOptions local_258;
  
  DefineOpts();
  bVar2 = CLOptions::ParseCommandLine(&local_258.super_CLOptions,argc,argv);
  if (!bVar2) {
    paVar1 = &local_348[0].field_2;
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"juliandate","");
    dVar3 = CLOptions::AsDouble(&local_258.super_CLOptions,local_348);
    CEDate::CEDate(local_298,dVar3,JD);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p);
    }
    local_348[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"ra","");
    local_380 = CLOptions::AsDouble(&local_258.super_CLOptions,local_348);
    CEAngle::Deg((double *)local_3d0);
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"dec","");
    local_388 = CLOptions::AsDouble(&local_258.super_CLOptions,&local_3b8);
    CEAngle::Deg((double *)local_3e0);
    local_3bc = CIRS;
    CESkyCoord::CESkyCoord(local_378,local_3d0,local_3e0,&local_3bc);
    CEAngle::~CEAngle(local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p);
    }
    CEAngle::~CEAngle(local_3d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_348[0]._M_dataplus._M_p);
    }
    CEObserver::CEObserver((CEObserver *)local_348);
    CESkyCoord::ConvertToGalactic((CEDate *)&local_3b8,(CEObserver *)local_378);
    CEObserver::~CEObserver((CEObserver *)local_348);
    PrintResults(&local_258,(CESkyCoord *)&local_3b8);
    CESkyCoord::~CESkyCoord((CESkyCoord *)&local_3b8);
    CESkyCoord::~CESkyCoord(local_378);
    CEDate::~CEDate(local_298);
  }
  CEExecOptions::~CEExecOptions(&local_258);
  return 0;
}

Assistant:

int main(int argc, char** argv) 
{    
    // Get the options from the command line
    CEExecOptions opts = DefineOpts();
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Convert the coordinates
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);
    CESkyCoord cirs_coord(CEAngle::Deg(opts.AsDouble("ra")),
                          CEAngle::Deg(opts.AsDouble("dec")),
                          CESkyCoordType::CIRS);
    CESkyCoord gal_coord = cirs_coord.ConvertToGalactic(date);
    
    // Print the results
    PrintResults(opts, gal_coord);
    
    return 0 ;
}